

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void counting_callback_fn(char *str,void *data)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  ulong extraout_RDX;
  int iVar4;
  char *pcVar6;
  char *pcVar5;
  
  if (*data != 0x7fffffff) {
    *(int *)data = *data + 1;
    return;
  }
  counting_callback_fn_cold_1();
  lVar3 = 0;
  pcVar5 = str;
  do {
    pcVar6 = (char *)((ulong)pcVar5 & 0xffffffff);
    bVar1 = *(byte *)((long)data + lVar3);
    bVar2 = "scratch"[lVar3];
    pcVar5 = (char *)(ulong)((uint)bVar1 - (uint)bVar2);
    if (bVar1 == bVar2) {
      pcVar5 = pcVar6;
    }
    iVar4 = (int)pcVar5;
    if (bVar1 != bVar2) goto LAB_00149b2b;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  iVar4 = 0;
LAB_00149b2b:
  if (iVar4 == 0) {
    if (extraout_RDX < 0x1111111111111112) {
      return;
    }
  }
  else {
    (**(code **)str)("invalid scratch space",*(undefined8 *)(str + 8));
  }
  return;
}

Assistant:

static void counting_callback_fn(const char* str, void* data) {
    /* Dummy callback function that just counts. */
    int32_t *p;
    (void)str;
    p = data;
    CHECK(*p != INT32_MAX);
    (*p)++;
}